

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_movem_er(m68k_info *info,int opcode,int size)

{
  ulong uVar1;
  uint uVar2;
  
  MCInst_setOpcode(info->inst,0x11c);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = opcode;
  (info->extension).operands[1].type = M68K_OP_REG_BITS;
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar2 = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    uVar2 = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                          *(ushort *)(info->code + uVar1) >> 8);
  }
  info->pc = info->pc + 2;
  (info->extension).operands[1].register_bits = uVar2;
  get_ea_mode_op(info,(info->extension).operands,info->ir,opcode);
  return;
}

Assistant:

static void build_movem_er(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op1->type = M68K_OP_REG_BITS;
	op1->register_bits = read_imm_16(info);

	get_ea_mode_op(info, op0, info->ir, size);
}